

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<const_void_*,_(anonymous_namespace)::Data> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::Bucket::insert
          (Bucket *this)

{
  Node<const_void_*,_(anonymous_namespace)::Data> *pNVar1;
  size_t in_stack_00000008;
  Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *in_stack_00000010;
  
  pNVar1 = Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::insert
                     (in_stack_00000010,in_stack_00000008);
  return pNVar1;
}

Assistant:

Node *insert() const
        {
            return span->insert(index);
        }